

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O0

scalar_type
pico_tree::internal::
sum<double_const*,double_const*,double_const*,pico_tree::internal::squared_r1_distance_fn>
          (long param_1,long param_2,squared_r1_distance_fn *param_3)

{
  double dVar1;
  scalar_type d;
  double x;
  long local_10;
  
  x = 0.0;
  for (local_10 = param_1; local_10 != param_2; local_10 = local_10 + 8) {
    dVar1 = squared_r1_distance_fn::operator()(param_3,x,5.33497519101482e-318);
    x = dVar1 + x;
    param_3 = param_3 + 8;
  }
  return x;
}

Assistant:

constexpr auto sum(
    InputIterator1_ begin1,
    InputSentinel1_ end1,
    InputIterator2_ begin2,
    BinaryOperator op) {
  using scalar_type =
      typename std::iterator_traits<InputIterator1_>::value_type;

  scalar_type d{};

  for (; begin1 != end1; ++begin1, ++begin2) {
    d += op(*begin1, *begin2);
  }

  return d;
}